

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O3

string * __thiscall
embree::supportedTargetList_abi_cxx11_(string *__return_storage_ptr__,embree *this,int features)

{
  uint uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = ~(uint)this;
  if ((uVar1 & 0x2000001) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x2000003) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x2000007) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x200000f) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x200001f) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x200007f) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x60000ff) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x60001ff) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x6007dff) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0xe737dff) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x10000003) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 & 0x26007dff) == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string supportedTargetList (int features)
  {
    std::string v;
    if (hasISA(features,SSE)) v += "SSE ";
    if (hasISA(features,SSE2)) v += "SSE2 ";
    if (hasISA(features,SSE3)) v += "SSE3 ";
    if (hasISA(features,SSSE3)) v += "SSSE3 ";
    if (hasISA(features,SSE41)) v += "SSE4.1 ";
    if (hasISA(features,SSE42)) v += "SSE4.2 ";
    if (hasISA(features,AVX)) v += "AVX ";
    if (hasISA(features,AVXI)) v += "AVXI ";
    if (hasISA(features,AVX2)) v += "AVX2 ";
    if (hasISA(features,AVX512)) v += "AVX512 ";

    if (hasISA(features,NEON)) v += "NEON ";
    if (hasISA(features,NEON_2X)) v += "2xNEON ";
    return v;
  }